

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

void __thiscall FixedSizeCache<double>::add(FixedSizeCache<double> *this,double value)

{
  int iVar1;
  pointer pdVar2;
  runtime_error *this_00;
  
  iVar1 = this->_count;
  pdVar2 = (this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar2) >> 3) <= iVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"FixedSizeCache::add() called on full cache");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)(long)iVar1 <
      (ulong)((long)(this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar2 >> 3)) {
    pdVar2[iVar1] = value;
    this->_count = iVar1 + 1;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

bool
    full() const
    {
        return (this->_count >= (int)this->_data.size());
    }